

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_args.c
# Opt level: O2

int mpt_object_args(mpt_object *obj,mpt_iterator *args)

{
  mpt_type_t mVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  mpt_value *pmVar5;
  char *pcVar6;
  ulong uVar7;
  char *prop;
  ulong __n;
  ulong uStack_180;
  char *local_178;
  undefined8 uStack_170;
  mpt_value local_168;
  char *local_158;
  undefined8 uStack_150;
  ulong local_148;
  void *ptr;
  char name [256];
  
  local_158 = (char *)0x0;
  uStack_150 = 0;
  local_168._addr = (char **)0x0;
  local_168._type = 0;
  local_178 = (char *)0x0;
  uStack_170 = 0;
  uVar7 = 0;
  do {
    pmVar5 = (*args->_vptr->value)(args);
    if (pmVar5 == (mpt_value *)0x0) {
LAB_00115eb6:
      return (int)uVar7;
    }
    local_178 = (char *)0x0;
    local_168._type = 0;
    ptr = pmVar5->_addr;
    mVar1 = pmVar5->_type;
    if (((mVar1 == 0x80) || (mVar1 == 0x801)) || (mVar1 - 0x100 < 0x700)) {
      puVar2 = *ptr;
      iVar3 = (**(code **)*puVar2)(puVar2,0x1a,&local_178);
      if ((iVar3 < 0) || (iVar3 = mpt_object_set_value(obj,local_178,&local_168), iVar3 < 0)) {
        local_168._type = 0;
        (**(code **)*puVar2)(puVar2,0x73,&local_178);
      }
    }
    if (local_168._type == 0) {
      if ((local_178 == (char *)0x0) &&
         (local_178 = mpt_data_tostring(&ptr,pmVar5->_type,(size_t *)0x0), local_178 == (char *)0x0)
         ) {
LAB_00115eaa:
        uStack_180 = 0xfffffffffffffffe;
      }
      else {
        prop = local_178;
        pcVar6 = strchr(local_178,0x3d);
        local_168._type = 0x73;
        if (pcVar6 == (char *)0x0) {
          local_158 = (char *)0x0;
          local_168._addr = &local_158;
LAB_00115e7b:
          iVar3 = mpt_object_set_value(obj,prop,&local_168);
          if (-1 < iVar3) goto LAB_00115e8f;
          goto LAB_00115eaa;
        }
        local_158 = pcVar6 + 1;
        local_168._addr = &local_158;
        __n = (long)pcVar6 - (long)prop;
        if (__n < 0x100) {
          local_148 = uVar7;
          memcpy(name,prop,__n);
          name[__n] = '\0';
          uVar7 = local_148;
          prop = name;
          local_178 = name;
          goto LAB_00115e7b;
        }
        uStack_180 = 0xffffffffffffffef;
      }
      iVar3 = (int)uVar7;
      uVar7 = uVar7 & 0xffffffff;
      if (iVar3 == 0) {
        uVar7 = uStack_180 & 0xffffffff;
      }
      goto LAB_00115eb6;
    }
LAB_00115e8f:
    uVar4 = (*args->_vptr->advance)(args);
    iVar3 = (int)uVar7;
    if ((int)uVar4 < 1) {
      uVar7 = uVar7 & 0xffffffff;
      if (iVar3 != 0) {
        uVar7 = (ulong)uVar4;
      }
      goto LAB_00115eb6;
    }
    uVar7 = (ulong)(iVar3 + 1);
  } while( true );
}

Assistant:

extern int mpt_object_args(MPT_INTERFACE(object) *obj, MPT_INTERFACE(iterator) *args)
{
	MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
	const MPT_STRUCT(value) *val;
	int count;
	
	count = 0;
	while ((val = args->_vptr->value(args))) {
		const void *ptr;
		int res;
		
		if (!val) {
			break;
		}
		pr.name = 0;
		pr.val._type = 0;
		ptr = val->_addr;
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv = *((void * const *) ptr);
			
			if (conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr) < 0
			 || mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				pr.val._type = 0;
				conv->_vptr->convert(conv, 's', &pr.name);
			}
		}
		/* value is not assigned via property */
		if (!pr.val._type) {
			char name[256];
			const char *str;
			if (!pr.name && !(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
				return count ? count : MPT_ERROR(BadValue);
			}
			/* set non-assign options to default value */
			if (!(str = strchr(pr.name, '='))) {
				MPT_property_set_string(&pr, 0);
			} else {
				size_t len;
				MPT_property_set_string(&pr, str + 1);
				len = str - pr.name;
				if (len >= sizeof(name)) {
					return count ? count : MPT_ERROR(MissingBuffer);
				}
				pr.name = memcpy(name, pr.name, len);
				name[len++] = 0;
			}
			/* assign config */
			if (mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				return count ? count : MPT_ERROR(BadValue);
			}
		}
		if ((res = args->_vptr->advance(args)) <= 0) {
			return count ? res : count;
		}
		++count;
	}
	return count;
}